

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# config.h
# Opt level: O1

string * trun::Config::ModuleExecutionTypeToStr_abi_cxx11_(ModuleExecutionType type)

{
  _Hash_node_base *p_Var1;
  int iVar2;
  string *psVar3;
  long lVar4;
  key_type in_EDI;
  __node_base_ptr p_Var5;
  __node_base_ptr p_Var6;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar7;
  undefined1 local_87;
  undefined1 local_86;
  undefined1 local_85;
  key_type local_84;
  ModuleExecutionType local_80 [2];
  pair<const_trun::ModuleExecutionType,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_78;
  pair<const_trun::ModuleExecutionType,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_50;
  
  local_84 = in_EDI;
  if ((ModuleExecutionTypeToStr[abi:cxx11](trun::ModuleExecutionType)::type2str_abi_cxx11_ == '\0')
     && (iVar2 = __cxa_guard_acquire(&ModuleExecutionTypeToStr[abi:cxx11](trun::ModuleExecutionType)
                                      ::type2str_abi_cxx11_), iVar2 != 0)) {
    local_80[1] = 0;
    std::
    pair<const_trun::ModuleExecutionType,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::pair<trun::ModuleExecutionType,_const_char_(&)[11],_true>
              (&local_78,local_80 + 1,(char (*) [11])"Sequential");
    local_80[0] = kParallel;
    std::
    pair<const_trun::ModuleExecutionType,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::pair<trun::ModuleExecutionType,_const_char_(&)[9],_true>
              (&local_50,local_80,(char (*) [9])"Parallel");
    std::
    _Hashtable<trun::ModuleExecutionType,std::pair<trun::ModuleExecutionType_const,std::__cxx11::string>,std::allocator<std::pair<trun::ModuleExecutionType_const,std::__cxx11::string>>,std::__detail::_Select1st,std::equal_to<trun::ModuleExecutionType>,std::hash<trun::ModuleExecutionType>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
    ::_Hashtable<std::pair<trun::ModuleExecutionType_const,std::__cxx11::string>const*>
              ((_Hashtable<trun::ModuleExecutionType,std::pair<trun::ModuleExecutionType_const,std::__cxx11::string>,std::allocator<std::pair<trun::ModuleExecutionType_const,std::__cxx11::string>>,std::__detail::_Select1st,std::equal_to<trun::ModuleExecutionType>,std::hash<trun::ModuleExecutionType>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
                *)&ModuleExecutionTypeToStr[abi:cxx11](trun::ModuleExecutionType)::
                   type2str_abi_cxx11_,&local_78,&stack0xffffffffffffffd8,0,&local_85,&local_86,
               &local_87);
    lVar4 = -0x50;
    paVar7 = &local_50.second.field_2;
    do {
      if (paVar7 != (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)(&paVar7->_M_allocated_capacity)[-2]) {
        operator_delete((long *)(&paVar7->_M_allocated_capacity)[-2],
                        paVar7->_M_allocated_capacity + 1);
      }
      paVar7 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                *)(&paVar7->_M_allocated_capacity + -5);
      lVar4 = lVar4 + 0x28;
    } while (lVar4 != 0);
    __cxa_atexit(std::
                 unordered_map<trun::ModuleExecutionType,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<trun::ModuleExecutionType>,_std::equal_to<trun::ModuleExecutionType>,_std::allocator<std::pair<const_trun::ModuleExecutionType,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 ::~unordered_map,
                 &ModuleExecutionTypeToStr[abi:cxx11](trun::ModuleExecutionType)::
                  type2str_abi_cxx11_,&__dso_handle);
    __cxa_guard_release(&ModuleExecutionTypeToStr[abi:cxx11](trun::ModuleExecutionType)::
                         type2str_abi_cxx11_);
  }
  if ((ModuleExecutionTypeToStr[abi:cxx11](trun::ModuleExecutionType)::unknown_abi_cxx11_ == '\0')
     && (iVar2 = __cxa_guard_acquire(&ModuleExecutionTypeToStr[abi:cxx11](trun::ModuleExecutionType)
                                      ::unknown_abi_cxx11_), iVar2 != 0)) {
    ModuleExecutionTypeToStr[abi:cxx11](trun::ModuleExecutionType)::unknown_abi_cxx11_._M_dataplus.
    _M_p = (pointer)&ModuleExecutionTypeToStr[abi:cxx11](trun::ModuleExecutionType)::
                     unknown_abi_cxx11_.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)
               &ModuleExecutionTypeToStr[abi:cxx11](trun::ModuleExecutionType)::unknown_abi_cxx11_,
               "unknown","");
    __cxa_atexit(std::__cxx11::string::~string,
                 &ModuleExecutionTypeToStr[abi:cxx11](trun::ModuleExecutionType)::unknown_abi_cxx11_
                 ,&__dso_handle);
    __cxa_guard_release(&ModuleExecutionTypeToStr[abi:cxx11](trun::ModuleExecutionType)::
                         unknown_abi_cxx11_);
  }
  p_Var5 = ModuleExecutionTypeToStr[abi:cxx11](trun::ModuleExecutionType)::type2str_abi_cxx11_._M_h.
           _M_buckets
           [(ulong)(long)(int)local_84 %
            ModuleExecutionTypeToStr[abi:cxx11](trun::ModuleExecutionType)::type2str_abi_cxx11_._M_h
            ._M_bucket_count];
  p_Var6 = (__node_base_ptr)0x0;
  if ((p_Var5 != (__node_base_ptr)0x0) &&
     (p_Var1 = p_Var5->_M_nxt, p_Var6 = p_Var5, local_84 != *(key_type *)&p_Var5->_M_nxt[1]._M_nxt))
  {
    while (p_Var5 = p_Var1, p_Var1 = p_Var5->_M_nxt, p_Var1 != (_Hash_node_base *)0x0) {
      p_Var6 = (__node_base_ptr)0x0;
      if (((ulong)(long)(int)*(key_type *)&p_Var1[1]._M_nxt %
           ModuleExecutionTypeToStr[abi:cxx11](trun::ModuleExecutionType)::type2str_abi_cxx11_._M_h.
           _M_bucket_count !=
           (ulong)(long)(int)local_84 %
           ModuleExecutionTypeToStr[abi:cxx11](trun::ModuleExecutionType)::type2str_abi_cxx11_._M_h.
           _M_bucket_count) || (p_Var6 = p_Var5, local_84 == *(key_type *)&p_Var1[1]._M_nxt))
      goto LAB_0011cfa3;
    }
    p_Var6 = (__node_base_ptr)0x0;
  }
LAB_0011cfa3:
  psVar3 = &ModuleExecutionTypeToStr[abi:cxx11](trun::ModuleExecutionType)::unknown_abi_cxx11_;
  if ((p_Var6 != (__node_base_ptr)0x0) && (p_Var6->_M_nxt != (_Hash_node_base *)0x0)) {
    psVar3 = std::__detail::
             _Map_base<trun::ModuleExecutionType,_std::pair<const_trun::ModuleExecutionType,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_trun::ModuleExecutionType,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<trun::ModuleExecutionType>,_std::hash<trun::ModuleExecutionType>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
             ::operator[]((_Map_base<trun::ModuleExecutionType,_std::pair<const_trun::ModuleExecutionType,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_trun::ModuleExecutionType,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<trun::ModuleExecutionType>,_std::hash<trun::ModuleExecutionType>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                           *)&ModuleExecutionTypeToStr[abi:cxx11](trun::ModuleExecutionType)::
                              type2str_abi_cxx11_,&local_84);
  }
  return psVar3;
}

Assistant:

static const std::string &ModuleExecutionTypeToStr(ModuleExecutionType type) {
            static std::unordered_map<ModuleExecutionType, std::string> type2str = {
                    {ModuleExecutionType::kSequential, "Sequential"},
                    {ModuleExecutionType::kParallel, "Parallel"},
            };
            static std::string unknown = "unknown";
            if (type2str.find(type) == type2str.end()) {
                return unknown;
            }
            return type2str[type];
        }